

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think.c
# Opt level: O3

_Bool borg_think(void)

{
  ushort uVar1;
  int iVar2;
  loc grid;
  int *piVar3;
  _Bool _Var4;
  errr eVar5;
  wchar_t wVar6;
  char *pcVar7;
  ushort **ppuVar8;
  long lVar9;
  keycode_t k;
  player *ppVar10;
  char cVar11;
  ulong uVar12;
  uint8_t t_a;
  char buf [128];
  uint8_t local_b9;
  undefined4 local_b8;
  char cStack_b4;
  undefined2 uStack_b3;
  undefined1 uStack_b1;
  undefined4 uStack_b0;
  char local_ac;
  char local_aa;
  
  borg_notice_player();
  if (borg_do_equip == true) {
    borg_do_equip = false;
    borg_cheat_equip();
    return false;
  }
  if (borg_do_inven == true) {
    borg_do_inven = false;
    borg_cheat_inven();
    borg_cheat_store();
    return false;
  }
  memcpy(safe_items,borg_items,
         ((ulong)z_info->quiver_size + (ulong)z_info->pack_size) * 0x388 + 0x2a60);
  if (borg_save == true) {
    borg_save_game();
    borg_note("# Auto Save!");
    ppVar10 = player;
    borg_save = false;
    if ((borg.trait[0x23] < borg_cfg[0x1d]) &&
       (pcVar7 = strstr(player->died_from,"starvation"), pcVar7 == (char *)0x0)) {
      return true;
    }
    memcpy(borg_think::svSavefile,savefile,0x400);
    cVar11 = ppVar10->full_name[0];
    if (cVar11 == '\0') {
      lVar9 = 0;
    }
    else {
      ppuVar8 = __ctype_b_loc();
      lVar9 = 0;
      do {
        uVar12 = (ulong)cVar11;
        uVar1 = (*ppuVar8)[uVar12];
        if ((uVar1 & 2) != 0) {
          quit_fmt("Illegal control char (0x%02X) in player name",uVar12 & 0xffffffff);
          uVar1 = (*ppuVar8)[uVar12];
          ppVar10 = player;
        }
        if ((uVar1 & 0xc00) == 0) {
          cVar11 = '_';
        }
        borg_think::svSavefile2[lVar9] = cVar11;
        cVar11 = ppVar10->full_name[lVar9 + 1];
        lVar9 = lVar9 + 1;
      } while (cVar11 != '\0');
    }
    borg_think::svSavefile2[lVar9] = '\0';
    path_build(savefile,0x400,ANGBAND_DIR_ARCHIVE,borg_think::svSavefile2);
    borg_think_justSaved = 1;
    return true;
  }
  if (borg_think_justSaved == '\x01') {
    memcpy(savefile,borg_think::svSavefile,0x400);
    borg_save_game();
    borg_think_justSaved = 0;
    return true;
  }
  eVar5 = borg_what_text(L'\0',L'\0',L'\n',&local_b9,(char *)&local_b8);
  if ((((eVar5 != 0) ||
       (CONCAT17(local_ac,CONCAT43(uStack_b0,CONCAT12(uStack_b1,uStack_b3))) != 0x2029746e656d70 ||
        CONCAT17(uStack_b1,CONCAT25(uStack_b3,CONCAT14(cStack_b4,local_b8))) != 0x656d706975714528))
      && ((eVar5 = borg_what_text(L'\0',L'\0',L'\n',&local_b9,(char *)&local_b8), eVar5 != 0 ||
          (CONCAT17(local_ac,CONCAT43(uStack_b0,CONCAT12(uStack_b1,uStack_b3))) != 0x202979726f746e
           || CONCAT17(uStack_b1,CONCAT25(uStack_b3,CONCAT14(cStack_b4,local_b8))) !=
              0x6f746e65766e4928)))) &&
     ((eVar5 = borg_what_text(L'\0',L'\0',L'\x06',&local_b9,(char *)&local_b8), eVar5 != 0 ||
      (CONCAT22(uStack_b3,CONCAT11(cStack_b4,local_b8._3_1_)) != 0x6f2072 || local_b8 != 0x72616557)
      ))) {
    if (borg_do_spell == true) {
      borg_cheat_spells();
      borg_do_spell = false;
    }
    eVar5 = borg_what_text(L'7',L'\x01',L'\xfffffff4',&local_b9,(char *)&local_b8);
    if ((eVar5 != 0) ||
       (CONCAT17(local_ac,CONCAT43(uStack_b0,CONCAT12(uStack_b1,uStack_b3))) != 0x6c69614620616e ||
        CONCAT17(uStack_b1,CONCAT25(uStack_b3,CONCAT14(cStack_b4,local_b8))) != 0x20616e614d20764c))
    {
      if (borg.trait[0x6b] != 0) {
        if (borg_cfg[0x11] != 0) {
          borg_write_map(false);
          borg_oops("retire");
        }
        if (borg_cfg[0x13] != 0) {
          borg_write_map(false);
          borg_log_death();
          borg_log_death_data();
          reincarnate_borg();
          borg_flush();
        }
      }
      _Var4 = player_is_shapechanged(player);
      if (_Var4) {
        borg_keypress(0x76);
        k = 0x72;
        goto LAB_00249ad3;
      }
      eVar5 = borg_what_text(L'\x01',L'\x03',L'\x04',&local_b9,(char *)&local_b8);
      if ((eVar5 == 0) &&
         ((cStack_b4 == '\0' && local_b8 == 0x726f7453 ||
          (cStack_b4 == '\0' && local_b8 == 0x656d6f48)))) {
        grid.x = (player->grid).x;
        grid.y = (player->grid).y;
        wVar6 = square_shopnum(cave,grid);
        shop_num = (int16_t)wVar6;
        borg.goal.type = 0;
        if (shop_num == 0) {
          borg_food_onsale = L'\0';
          borg_fuel_onsale = L'\0';
        }
        borg.trait[0x2d] = player->au;
        borg_cheat_store();
        borg_do_inven = true;
        borg_do_equip = true;
        borg_do_spell = true;
        borg_notice(true);
        borg.power = borg_power();
        if (borg_cancel == false) {
          borg.in_shop = true;
          _Var4 = borg_think_store();
          return _Var4;
        }
        return true;
      }
      w_y = Term->offset_y;
      w_x = Term->offset_x;
      borg_do_panel = false;
      eVar5 = borg_what_text(L'\0',L'\0',L'\x10',&local_b9,(char *)&local_b8);
      if ((eVar5 != 0) || (_Var4 = prefix((char *)&local_b8,"Map sector "), !_Var4)) {
        if (borg_do_panel != true) {
          if (borg_do_frame == true) {
            borg_do_frame = false;
            borg_notice_player();
          }
          piVar3 = borg.trait;
          borg_do_equip = true;
          borg_do_inven = true;
          borg_do_panel = true;
          borg_do_frame = true;
          borg_do_spell = true;
          if (borg.trait[0x24] < borg.trait[0x23]) {
            borg.trait[0x24] = borg.trait[0x23];
          }
          if (piVar3[0x6a] < piVar3[0x69]) {
            piVar3[0x6a] = piVar3[0x69];
          }
          borg_t = borg_t + 1;
          borg.time_this_panel = borg.time_this_panel + 1;
          borg_notice(true);
          borg_update();
          borg.power = borg_power();
          if (borg_cancel == false) {
            _Var4 = borg_think_dungeon();
            return _Var4;
          }
          return true;
        }
        borg_do_panel = false;
        k = 0x4c;
        goto LAB_00249ad3;
      }
      iVar2 = Term->sidebar_mode;
      uVar12 = (long)(Term->hgt - (row_top_map[iVar2] + row_bottom_map[iVar2])) /
               (long)(int)(uint)tile_height;
      w_y = ((int)(((uint)(uVar12 >> 0x1f) & 1) + (int)uVar12) >> 1) * (local_ac + -0x30);
      uVar12 = (long)(~col_map[iVar2] + Term->wid) / (long)(int)(uint)tile_width;
      w_x = ((int)(((uint)(uVar12 >> 0x1f) & 1) + (int)uVar12) >> 1) * (local_aa + -0x30);
    }
  }
  k = 0xe000;
LAB_00249ad3:
  borg_keypress(k);
  return true;
}

Assistant:

bool borg_think(void)
{
    int i;

    uint8_t t_a;

    char        buf[128];
    static char svSavefile[1024];
    static char svSavefile2[1024];
    static bool justSaved = false;

    /* Fill up part of the borg.trait[] array */
    (void)borg_notice_player();

    /*** Process inventory/equipment ***/

    /* Cheat */
    if (borg_do_equip) {
        /* Only do it once */
        borg_do_equip = false;

        /* Cheat the "equip" screen */
        borg_cheat_equip();

        /* Done */
        return false;
    }

    /* Cheat */
    if (borg_do_inven) {
        /* Only do it once */
        borg_do_inven = false;

        /* Cheat the "inven" screen */
        borg_cheat_inven();

        /* Do a quick cheat of the shops */
        borg_cheat_store();

        /* Done */
        return false;
    }

    /* save the items.  safe_items, from here on, should never be changed, */
    /* just copied from */
    memcpy(safe_items, borg_items, QUIVER_END * sizeof(borg_item));

    /* save now */
    if (borg_save && borg_save_game()) {
        /* Log */
        borg_note("# Auto Save!");

        borg_save = false;

        /* Create a scum file */
        if (borg.trait[BI_CLEVEL] >= borg_cfg[BORG_DUMP_LEVEL]
            || strstr(player->died_from, "starvation")) {
            memcpy(svSavefile, savefile, sizeof(savefile));
            /* Process the player name */
            for (i = 0; player->full_name[i]; i++) {
                char c = player->full_name[i];

                /* No control characters */
                if (iscntrl(c)) {
                    /* Illegal characters */
                    quit_fmt("Illegal control char (0x%02X) in player name", c);
                }

                /* Convert all non-alphanumeric symbols */
                if (!isalpha(c) && !isdigit(c))
                    c = '_';

                /* Build "file_name" */
                svSavefile2[i] = c;
            }
            svSavefile2[i] = 0;

            path_build(savefile, 1024, ANGBAND_DIR_ARCHIVE, svSavefile2);

            justSaved = true;
        }
        return true;
    }
    if (justSaved) {
        memcpy(savefile, svSavefile, sizeof(savefile));
        borg_save_game();
        justSaved = false;
        return true;
    }

    /* Parse "equip" mode */
    if ((0 == borg_what_text(0, 0, 10, &t_a, buf))
        && (streq(buf, "(Equipment) "))) {
        /* Parse the "equip" screen */
        /* borg_parse_equip(); */

        /* Leave this mode */
        borg_keypress(ESCAPE);

        /* Done */
        return true;
    }

    /* Parse "inven" mode */
    if ((0 == borg_what_text(0, 0, 10, &t_a, buf))
        && (streq(buf, "(Inventory) "))) {
        /* Parse the "inven" screen */
        /* borg_parse_inven(); */

        /* Leave this mode */
        borg_keypress(ESCAPE);

        /* Done */
        return true;
    }

    /* Parse "inven" mode */
    if ((0 == borg_what_text(0, 0, 6, &t_a, buf)) && (streq(buf, "Wear o"))) {
        /* Leave this mode */
        borg_keypress(ESCAPE);

        /* Done */
        return true;
    }

    /*** Process books/spells ***/
    if (borg_do_spell) {
        borg_cheat_spells();
        borg_do_spell = false;
    }


    /* Check for "browse" mode */
    if ((0 == borg_what_text(COL_SPELL, ROW_SPELL, -12, &t_a, buf))
        && (streq(buf, "Lv Mana Fail"))) {
        /* Parse the "spell" screen */
        /* borg_parse_spell(borg_do_spell_aux); */

        /* Advance to the next book */
        /* borg_do_spell_aux++; */

        /* Leave that mode */
        borg_keypress(ESCAPE);

        /* Done */
        return true;
    }

    /* If king, maybe retire. */
    if (borg.trait[BI_KING]) {
        /* Prepare to retire */
        if (borg_cfg[BORG_STOP_KING]) {
#ifndef BABLOS
            borg_write_map(false);
#endif /* bablos */
            borg_oops("retire");
        }
        /* Borg will be respawning */
        if (borg_cfg[BORG_RESPAWN_WINNERS]) {
#ifndef BABLOS
            borg_write_map(false);
#if 0
            /* Note the score */
            borg_enter_score();
#endif
            /* Write to log and borg.dat */
            borg_log_death();
            borg_log_death_data();

            /* respawn */
            reincarnate_borg();

            borg_flush();
#endif /* bablos */
        }
    }

    /* Hack -- always revert shapechanged players to normal form */
    if (player_is_shapechanged(player)) {
        /* it looks like throw is a good command that checks */
        /* your form without a prerequisite check */
        borg_keypress('v');
        borg_keypress('r');
        return true;
    }

    /*** Handle stores ***/

    /* Hack -- Check for being in a store CHEAT*/
    if ((0 == borg_what_text(1, 3, 4, &t_a, buf))
        && (streq(buf, "Stor") || streq(buf, "Home"))) {
        /* Cheat the store number */
        shop_num = square_shopnum(cave, player->grid);

        /* Clear the goal (the goal was probably going to a shop number) */
        borg.goal.type = 0;

        /* Hack -- Reset food counter for money scumming */
        if (shop_num == 0)
            borg_food_onsale = 0;

        /* Hack -- Reset fuel counter for money scumming */
        if (shop_num == 0)
            borg_fuel_onsale = 0;

        /* Extract the current gold (unless in home) */
        borg.trait[BI_GOLD] = (long)player->au;

        /* Cheat the store (or home) inventory (all pages) */
        borg_cheat_store();

        /* Recheck inventory */
        borg_do_inven = true;

        /* Recheck equipment */
        borg_do_equip = true;

        /* Recheck spells */
        borg_do_spell = true;

        /* Examine the inventory */
        borg_notice(true);

        /* Evaluate the current world */
        borg.power = borg_power();

        /* Hack -- allow user abort */
        if (borg_cancel)
            return true;

        /* Do not allow a user key to interrupt the borg while in a store */
        borg.in_shop = true;

        /* Think until done */
        return (borg_think_store());
    }

    /*** Determine panel ***/

    /* Hack -- cheat */
    w_y = Term->offset_y;
    w_x = Term->offset_x;

    /* Done */
    borg_do_panel = false;

    /* Hack -- Check for "sector" mode */
    if ((0 == borg_what_text(0, 0, 16, &t_a, buf))
        && (prefix(buf, "Map sector "))) {
        /* Hack -- get the panel info */
        w_y = (buf[12] - '0') * (SCREEN_HGT / 2);
        w_x = (buf[14] - '0') * (SCREEN_WID / 2);

        /* Leave panel mode */
        borg_keypress(ESCAPE);

        /* Done */
        return true;
    }

    /* Check panel */
    if (borg_do_panel) {
        /* Only do it once */
        borg_do_panel = false;

        /* Enter "panel" mode */
        borg_keypress('L');

        /* Done */
        return true;
    }

    /*** Analyze the Frame ***/

    /* Analyze the frame */
    if (borg_do_frame) {
        /* Only once */
        borg_do_frame = false;

        /* Analyze the "frame" */
        borg_notice_player();
    }

    /*** Re-activate Tests ***/

    /* Check equip again later */
    borg_do_equip = true;

    /* Check inven again later */
    borg_do_inven = true;

    /* Check panel again later */
    borg_do_panel = true;

    /* Check frame again later */
    borg_do_frame = true;

    /* Check spells again later */
    borg_do_spell = true;

    /*** Analyze status ***/

    /* Track best level */
    if (borg.trait[BI_CLEVEL] > borg.trait[BI_MAXCLEVEL])
        borg.trait[BI_MAXCLEVEL] = borg.trait[BI_CLEVEL];
    if (borg.trait[BI_CDEPTH] > borg.trait[BI_MAXDEPTH]) {
        borg.trait[BI_MAXDEPTH] = borg.trait[BI_CDEPTH];
    }

    /*** Think about it ***/

    /* Increment the clock */
    borg_t++;

    /* Increment the panel clock */
    borg.time_this_panel++;

    /* Examine the equipment/inventory */
    borg_notice(true);

    /* Examine the screen */
    borg_update();

    /* Evaluate the current world */
    borg.power = borg_power();

    /* Hack -- allow user abort */
    if (borg_cancel)
        return true;

    /* Do something */
    return (borg_think_dungeon());
}